

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O0

PClassActor * DecoDerivedClass(FScriptPosition *sc,PClassActor *parent,FName *typeName)

{
  bool bVar1;
  char *pcVar2;
  FString *this;
  char *pcVar3;
  FName local_50 [4];
  FString local_40;
  FString sourcefile;
  FString newname;
  PClassActor *local_28;
  PClassActor *type;
  FName *typeName_local;
  PClassActor *parent_local;
  FScriptPosition *sc_local;
  
  FName::FName((FName *)((long)&newname.Chars + 4),typeName);
  local_28 = (PClassActor *)
             PClass::CreateDerivedClass
                       (&parent->super_PClass,(FName *)((long)&newname.Chars + 4),
                        *(uint *)((long)&(parent->super_PClass).super_PNativeStruct.super_PStruct.
                                         super_PNamedType.super_PCompoundType.super_PType.
                                         super_PTypeBase + 0x24));
  if (local_28 == (PClassActor *)0x0) {
    pcVar2 = FName::GetChars(typeName);
    FString::FString(&sourcefile,pcVar2);
    FString::FString(&local_40,&sc->FileName);
    FString::Substitute(&local_40,":","@");
    this = FString::operator<<(&sourcefile,'@');
    FString::operator<<(this,&local_40);
    bVar1 = FBoolCVar::operator_cast_to_bool(&strictdecorate);
    if (bVar1) {
      pcVar2 = FName::GetChars(typeName);
      FScriptPosition::Message(sc,2,"Tried to define class \'%s\' more than once.",pcVar2);
    }
    else {
      pcVar2 = FName::GetChars(typeName);
      pcVar3 = FString::GetChars(&sourcefile);
      FScriptPosition::Message
                (sc,0,"Tried to define class \'%s\' more than once. Renaming class to \'%s\'",pcVar2
                 ,pcVar3);
    }
    FName::FName(local_50,&sourcefile);
    local_28 = (PClassActor *)
               PClass::CreateDerivedClass
                         (&parent->super_PClass,local_50,
                          *(uint *)((long)&(parent->super_PClass).super_PNativeStruct.super_PStruct.
                                           super_PNamedType.super_PCompoundType.super_PType.
                                           super_PTypeBase + 0x24));
    if (local_28 == (PClassActor *)0x0) {
      pcVar2 = FName::GetChars(typeName);
      FScriptPosition::Message
                (sc,1,"Tried to define class \'%s\' more than twice in the same file.",pcVar2);
    }
    FString::~FString(&local_40);
    FString::~FString(&sourcefile);
  }
  return local_28;
}

Assistant:

PClassActor *DecoDerivedClass(const FScriptPosition &sc, PClassActor *parent, FName typeName)
{
	PClassActor *type = static_cast<PClassActor *>(parent->CreateDerivedClass(typeName, parent->Size));
	if (type == nullptr)
	{
		FString newname = typeName.GetChars();
		FString sourcefile = sc.FileName;

		sourcefile.Substitute(":", "@");
		newname << '@' << sourcefile;
		if (strictdecorate)
		{
			sc.Message(MSG_ERROR, "Tried to define class '%s' more than once.", typeName.GetChars());
		}
		else
		{
			// Due to backwards compatibility issues this cannot be an unconditional error.
			sc.Message(MSG_WARNING, "Tried to define class '%s' more than once. Renaming class to '%s'", typeName.GetChars(), newname.GetChars());
		}
		type = static_cast<PClassActor *>(parent->CreateDerivedClass(newname, parent->Size));
		if (type == nullptr)
		{
			// This we cannot handle cleanly anymore. Let's just abort and forget about the odd mod out that was this careless.
			sc.Message(MSG_FATAL, "Tried to define class '%s' more than twice in the same file.", typeName.GetChars());
		}
	}
	return type;
}